

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

QByteArray * __thiscall
QMetaMethod::parameterTypeName(QByteArray *__return_storage_ptr__,QMetaMethod *this,int index)

{
  QMetaObject *mo;
  uint *puVar1;
  QByteArrayView view;
  
  mo = this->mobj;
  if ((index < 0 || mo == (QMetaObject *)0x0) || (puVar1 = (this->data).d, (int)puVar1[1] <= index))
  {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    view = typeNameFromTypeInfo(mo,(mo->d).data[(int)(puVar1[2] + index + 1)]);
    stringData(__return_storage_ptr__,mo,view);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QMetaMethod::parameterTypeName(int index) const
{
    if (!mobj || index < 0 || index >= parameterCount())
        return {};
    // ### Qt 7: change the return type and make noexcept
    return stringData(mobj, QMetaMethodPrivate::get(this)->parameterTypeName(index));
}